

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFBO.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderFramebufferTextureArgumentRefersToBufferTexture::deinit
          (GeometryShaderFramebufferTextureArgumentRefersToBufferTexture *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_bo_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_bo_id);
    this->m_bo_id = 0;
  }
  if (this->m_fbo_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo_id);
    this->m_fbo_id = 0;
    (**(code **)(lVar2 + 0x78))(0x8d40,0);
  }
  if (this->m_tbo_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_tbo_id);
    this->m_tbo_id = 0;
  }
  if (this->m_texels != (GLint *)0x0) {
    operator_delete__(this->m_texels);
    this->m_texels = (GLint *)0x0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderFramebufferTextureArgumentRefersToBufferTexture::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);
		m_bo_id = 0;
	}

	if (m_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);
		m_fbo_id = 0;

		gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	}

	if (m_tbo_id != 0)
	{
		gl.deleteTextures(1, &m_tbo_id);
		m_tbo_id = 0;
	}

	if (m_texels != NULL)
	{
		delete[] m_texels;
		m_texels = NULL;
	}

	/* Release base class */
	TestCaseBase::deinit();
}